

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

void __thiscall arangodb::velocypack::Parser::parseFalse(Parser *this)

{
  ValueLength *pVVar1;
  ulong uVar2;
  ulong uVar3;
  Builder *this_00;
  ValueLength VVar4;
  Exception *this_01;
  
  uVar2 = this->_size;
  uVar3 = this->_pos;
  if (((((uVar3 < uVar2) && (this->_pos = uVar3 + 1, this->_start[uVar3] == 'a')) &&
       (uVar3 = this->_pos, uVar3 < uVar2)) &&
      ((this->_pos = uVar3 + 1, this->_start[uVar3] == 'l' && (uVar3 = this->_pos, uVar3 < uVar2))))
     && ((this->_pos = uVar3 + 1, this->_start[uVar3] == 's' &&
         ((uVar3 = this->_pos, uVar3 < uVar2 && (this->_pos = uVar3 + 1, this->_start[uVar3] == 'e')
          ))))) {
    this_00 = this->_builderPtr;
    Builder::reserve(this_00,1);
    VVar4 = this_00->_pos;
    this_00->_pos = VVar4 + 1;
    this_00->_start[VVar4] = '\x19';
    pVVar1 = &this_00->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + 1;
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_01,ParseError,"Expecting \'false\'");
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline int consume() {
    if (_pos >= _size) {
      return -1;
    }
    return static_cast<int>(_start[_pos++]);
  }